

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhe25519.h
# Opt level: O3

void random_bytes(void *data,size_t len)

{
  undefined4 uVar1;
  int *alias;
  ulong uVar2;
  int extra;
  random_device rd;
  void *local_13b8;
  undefined4 local_13ac;
  random_device local_13a8;
  
  local_13b8 = data;
  std::random_device::random_device(&local_13a8);
  if (3 < len) {
    uVar2 = 0;
    do {
      uVar1 = std::random_device::_M_getval();
      *(undefined4 *)((long)&local_13b8 + uVar2 * 4) = uVar1;
      uVar2 = uVar2 + 1;
    } while (len >> 2 != uVar2);
  }
  if ((len & 3) != 0) {
    local_13ac = std::random_device::_M_getval();
    memcpy((void *)((len & 0xfffffffffffffffc) + (long)local_13b8),&local_13ac,len & 3);
  }
  std::random_device::_M_fini();
  return;
}

Assistant:

void random_bytes(void* data, size_t len) {
    int* alias = (int *)(&data);
    std::random_device rd;
    for (size_t i = 0; i < len / sizeof(int); ++i)
        alias[i] = rd();

    if (len % sizeof(int) != 0) {
			int extra = rd();
			memcpy((len/sizeof(int)*sizeof(int))+(char *) data, &extra, len%sizeof(4));
		}
}